

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::forceHighsSolutionBasisSize(Highs *this)

{
  size_type sVar1;
  long in_RDI;
  size_type in_stack_00000008;
  
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)this,in_stack_00000008);
  sVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(in_RDI + 0xa0))
  ;
  if (sVar1 != (long)*(int *)(in_RDI + 0x138)) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this,in_stack_00000008
              );
    *(undefined1 *)(in_RDI + 0x70) = 0;
    *(undefined1 *)(in_RDI + 0x72) = 0;
  }
  sVar1 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                    ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)(in_RDI + 0xb8))
  ;
  if (sVar1 != (long)*(int *)(in_RDI + 0x13c)) {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this,in_stack_00000008
              );
    *(undefined1 *)(in_RDI + 0x70) = 0;
    *(undefined1 *)(in_RDI + 0x72) = 0;
  }
  return;
}

Assistant:

void Highs::forceHighsSolutionBasisSize() {
  // Ensure that the HiGHS solution vectors are the right size
  solution_.col_value.resize(model_.lp_.num_col_);
  solution_.row_value.resize(model_.lp_.num_row_);
  solution_.col_dual.resize(model_.lp_.num_col_);
  solution_.row_dual.resize(model_.lp_.num_row_);
  // Ensure that the HiGHS basis vectors are the right size,
  // invalidating the basis if they aren't
  if (basis_.col_status.size() != static_cast<size_t>(model_.lp_.num_col_)) {
    basis_.col_status.resize(model_.lp_.num_col_);
    basis_.valid = false;
    basis_.useful = false;
  }
  if (basis_.row_status.size() != static_cast<size_t>(model_.lp_.num_row_)) {
    basis_.row_status.resize(model_.lp_.num_row_);
    basis_.valid = false;
    basis_.useful = false;
  }
}